

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::~Group(Group *this)

{
  Group *in_RDI;
  
  ~Group(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Group() {}